

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Unicode.hpp
# Opt level: O1

bool cppjieba::DecodeRunesInString(char *s,size_t len,Unicode *unicode)

{
  bool bVar1;
  long lVar2;
  ulong uVar3;
  RuneStrArray runes;
  undefined8 uStack_188;
  RuneStrArray local_180;
  
  if ((Unicode *)unicode->ptr_ != unicode) {
    free((Unicode *)unicode->ptr_);
  }
  unicode->ptr_ = unicode->buffer_;
  unicode->size_ = 0;
  unicode->capacity_ = 0x10;
  lVar2 = 8;
  do {
    *(undefined8 *)((long)&uStack_188 + lVar2) = 0;
    *(undefined4 *)((long)&local_180.buffer_[0].rune + lVar2) = 0;
    lVar2 = lVar2 + 0x14;
  } while (lVar2 != 0x148);
  local_180.size_ = 0;
  local_180.capacity_ = 0x10;
  local_180.ptr_ = local_180.buffer_;
  bVar1 = DecodeRunesInString(s,len,&local_180);
  if (bVar1) {
    limonp::LocalVector<unsigned_int>::reserve(unicode,local_180.size_);
    if (local_180.size_ != 0) {
      lVar2 = 0;
      uVar3 = 0;
      do {
        limonp::LocalVector<unsigned_int>::push_back
                  (unicode,(uint *)((long)&((RuneStr *)&(local_180.ptr_)->rune)->rune + lVar2));
        uVar3 = uVar3 + 1;
        lVar2 = lVar2 + 0x14;
      } while (uVar3 < local_180.size_);
    }
  }
  if ((RuneStrArray *)local_180.ptr_ != &local_180) {
    free(local_180.ptr_);
  }
  return bVar1;
}

Assistant:

inline bool DecodeRunesInString(const char* s, size_t len, Unicode& unicode) {
  unicode.clear();
  RuneStrArray runes;
  if (!DecodeRunesInString(s, len, runes)) {
    return false;
  }
  unicode.reserve(runes.size());
  for (size_t i = 0; i < runes.size(); i++) {
    unicode.push_back(runes[i].rune);
  }
  return true;
}